

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  ParseInfoTree *info_tree;
  FieldDescriptor *field_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint uVar4;
  CppType CVar5;
  undefined4 extraout_var;
  Token *pTVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *this_00;
  string *psVar7;
  LogMessage *other;
  FieldOptions *this_01;
  bool local_68b;
  byte local_642;
  FieldDescriptor *local_5d8;
  ParseLocation local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  byte local_533;
  byte local_532;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  byte local_493;
  byte local_492;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  byte local_3db;
  byte local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  byte local_3b3;
  byte local_3b2;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  LogFinisher local_362;
  byte local_361;
  LogMessage local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string lower_field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string part;
  string local_b8;
  uint local_98;
  allocator<char> local_81;
  string local_80;
  int local_60;
  int local_5c;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *message_local;
  ParserImpl *this_local;
  Reflection *reflection_00;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  reflection_00 = (Reflection *)CONCAT44(extraout_var,iVar2);
  field_name.field_2._8_8_ = Message::GetDescriptor(message);
  std::__cxx11::string::string((string *)&field);
  _start_column = (FieldDescriptor *)0x0;
  pTVar6 = io::Tokenizer::current(&this->tokenizer_);
  local_5c = pTVar6->line;
  pTVar6 = io::Tokenizer::current(&this->tokenizer_);
  local_60 = pTVar6->column;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"[",&local_81);
  bVar1 = TryConsume(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if (bVar1) {
    bVar1 = ConsumeIdentifier(this,(string *)&field);
    if (bVar1) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,".",(allocator<char> *)(part.field_2._M_local_buf + 0xf));
        bVar1 = TryConsume(this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)(part.field_2._M_local_buf + 0xf));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"]",&local_101);
          bVar1 = Consume(this,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator(&local_101);
          if (bVar1) {
            if (this->finder_ == (Finder *)0x0) {
              iVar2 = (*reflection_00->_vptr_Reflection[0x42])(reflection_00,&field);
              local_5d8 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar2);
            }
            else {
              iVar2 = (*this->finder_->_vptr_Finder[2])(this->finder_,message,&field);
              local_5d8 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar2);
            }
            _start_column = local_5d8;
            if (local_5d8 != (FieldDescriptor *)0x0) goto LAB_002c66b5;
            if ((this->allow_unknown_field_ & 1U) != 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&lower_field_name.field_2 + 8),"Extension \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field);
              std::operator+(&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&lower_field_name.field_2 + 8),
                             "\" is not defined or is not an extension of \"");
              psVar7 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
              std::operator+(&local_1c8,&local_1e8,psVar7);
              std::operator+(&local_1a8,&local_1c8,"\".");
              ReportWarning(this,&local_1a8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)(lower_field_name.field_2._M_local_buf + 8));
              goto LAB_002c66b5;
            }
            std::operator+(&local_188,"Extension \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &field);
            std::operator+(&local_168,&local_188,"\" is not defined or is not an extension of \"");
            psVar7 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
            std::operator+(&local_148,&local_168,psVar7);
            std::operator+(&local_128,&local_148,"\".");
            ReportError(this,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            this_local._7_1_ = 0;
            local_98 = 1;
          }
          else {
            this_local._7_1_ = 0;
            local_98 = 1;
          }
          break;
        }
        std::__cxx11::string::string((string *)local_e0);
        bVar1 = ConsumeIdentifier(this,(string *)local_e0);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)&field,".");
          std::__cxx11::string::operator+=((string *)&field,(string *)local_e0);
        }
        else {
          this_local._7_1_ = 0;
        }
        local_98 = (uint)!bVar1;
        std::__cxx11::string::~string((string *)local_e0);
      } while (local_98 == 0);
    }
    else {
      this_local._7_1_ = 0;
      local_98 = 1;
    }
  }
  else {
    bVar1 = ConsumeIdentifier(this,(string *)&field);
    if (bVar1) {
      _start_column =
           Descriptor::FindFieldByName((Descriptor *)field_name.field_2._8_8_,(string *)&field);
      if (_start_column == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string((string *)local_228,(string *)&field);
        LowerString((string *)local_228);
        _start_column =
             Descriptor::FindFieldByName((Descriptor *)field_name.field_2._8_8_,(string *)local_228)
        ;
        if ((_start_column != (FieldDescriptor *)0x0) &&
           (TVar3 = FieldDescriptor::type(_start_column), TVar3 != TYPE_GROUP)) {
          _start_column = (FieldDescriptor *)0x0;
        }
        std::__cxx11::string::~string((string *)local_228);
      }
      if ((_start_column != (FieldDescriptor *)0x0) &&
         (TVar3 = FieldDescriptor::type(_start_column), TVar3 == TYPE_GROUP)) {
        this_00 = FieldDescriptor::message_type(_start_column);
        psVar7 = Descriptor::name_abi_cxx11_(this_00);
        bVar1 = std::operator!=(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&field);
        if (bVar1) {
          _start_column = (FieldDescriptor *)0x0;
        }
      }
      if (_start_column == (FieldDescriptor *)0x0) {
        if ((this->allow_unknown_field_ & 1U) == 0) {
          psVar7 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
          std::operator+(&local_2a8,"Message type \"",psVar7);
          std::operator+(&local_288,&local_2a8,"\" has no field named \"");
          std::operator+(&local_268,&local_288,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field
                        );
          std::operator+(&local_248,&local_268,"\".");
          ReportError(this,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          this_local._7_1_ = 0;
          local_98 = 1;
          goto LAB_002c73c8;
        }
        psVar7 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        std::operator+(&local_328,"Message type \"",psVar7);
        std::operator+(&local_308,&local_328,"\" has no field named \"");
        std::operator+(&local_2e8,&local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
        std::operator+(&local_2c8,&local_2e8,"\".");
        ReportWarning(this,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
      }
LAB_002c66b5:
      if (_start_column == (FieldDescriptor *)0x0) {
        local_361 = 0;
        if ((this->allow_unknown_field_ & 1U) == 0) {
          internal::LogMessage::LogMessage
                    (&local_360,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                     ,0x17e);
          local_361 = 1;
          other = internal::LogMessage::operator<<
                            (&local_360,"CHECK failed: allow_unknown_field_: ");
          internal::LogFinisher::operator=(&local_362,other);
        }
        if ((local_361 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_360);
        }
        std::allocator<char>::allocator();
        local_3b2 = 0;
        local_3b3 = 0;
        local_3da = 0;
        local_3db = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,":",&local_389);
        bVar1 = TryConsume(this,&local_388);
        local_642 = 0;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_3b2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"{",&local_3b1);
          local_3b3 = 1;
          bVar1 = LookingAt(this,&local_3b0);
          local_642 = 0;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_3da = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"<",&local_3d9);
            local_3db = 1;
            bVar1 = LookingAt(this,&local_3d8);
            local_642 = bVar1 ^ 0xff;
          }
        }
        if ((local_3db & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3d8);
        }
        if ((local_3da & 1) != 0) {
          std::allocator<char>::~allocator(&local_3d9);
        }
        if ((local_3b3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3b0);
        }
        if ((local_3b2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3b1);
        }
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator(&local_389);
        if ((local_642 & 1) == 0) {
          this_local._7_1_ = SkipFieldMessage(this);
          local_98 = 1;
        }
        else {
          this_local._7_1_ = SkipFieldValue(this);
          local_98 = 1;
        }
      }
      else if (((this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) ||
               (bVar1 = FieldDescriptor::is_repeated(_start_column), bVar1)) ||
              (uVar4 = (*reflection_00->_vptr_Reflection[5])(reflection_00,message,_start_column),
              (uVar4 & 1) == 0)) {
        CVar5 = FieldDescriptor::cpp_type(_start_column);
        if (CVar5 == CPPTYPE_MESSAGE) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,":",&local_441);
          TryConsume(this,&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::allocator<char>::~allocator(&local_441);
          bVar1 = ConsumeFieldMessage(this,message,reflection_00,_start_column);
          if (!bVar1) {
            this_local._7_1_ = 0;
            local_98 = 1;
            goto LAB_002c73c8;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,":",&local_469);
          bVar1 = Consume(this,&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator(&local_469);
          if (!bVar1) {
            this_local._7_1_ = 0;
            local_98 = 1;
            goto LAB_002c73c8;
          }
          local_492 = 0;
          local_493 = 0;
          bVar1 = FieldDescriptor::is_repeated(_start_column);
          local_68b = false;
          if (bVar1) {
            std::allocator<char>::allocator();
            local_492 = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"[",&local_491);
            local_493 = 1;
            local_68b = TryConsume(this,&local_490);
          }
          if ((local_493 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_490);
          }
          if ((local_492 & 1) != 0) {
            std::allocator<char>::~allocator(&local_491);
          }
          if (local_68b != false) {
            do {
              bVar1 = ConsumeFieldValue(this,message,reflection_00,_start_column);
              if (!bVar1) {
                this_local._7_1_ = 0;
                local_98 = 1;
                goto LAB_002c73c8;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b8,"]",&local_4b9);
              bVar1 = TryConsume(this,&local_4b8);
              std::__cxx11::string::~string((string *)&local_4b8);
              std::allocator<char>::~allocator(&local_4b9);
              if (bVar1) goto LAB_002c70e3;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4e0,",",&local_4e1);
              bVar1 = Consume(this,&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              std::allocator<char>::~allocator(&local_4e1);
            } while (bVar1);
            this_local._7_1_ = 0;
            local_98 = 1;
            goto LAB_002c73c8;
          }
          bVar1 = ConsumeFieldValue(this,message,reflection_00,_start_column);
          if (!bVar1) {
            this_local._7_1_ = 0;
            local_98 = 1;
            goto LAB_002c73c8;
          }
        }
LAB_002c70e3:
        std::allocator<char>::allocator();
        local_532 = 0;
        local_533 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,";",&local_509);
        bVar1 = TryConsume(this,&local_508);
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_532 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,",",&local_531);
          local_533 = 1;
          TryConsume(this,&local_530);
        }
        if ((local_533 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_530);
        }
        if ((local_532 & 1) != 0) {
          std::allocator<char>::~allocator(&local_531);
        }
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
        this_01 = FieldDescriptor::options(_start_column);
        bVar1 = FieldOptions::deprecated(this_01);
        if (bVar1) {
          std::operator+(&local_578,"text format contains deprecated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field
                        );
          std::operator+(&local_558,&local_578,"\"");
          ReportWarning(this,&local_558);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)&local_578);
        }
        field_00 = _start_column;
        if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
          info_tree = this->parse_info_tree_;
          ParseLocation::ParseLocation(&local_580,local_5c,local_60);
          RecordLocation(info_tree,field_00,local_580);
        }
        this_local._7_1_ = 1;
        local_98 = 1;
      }
      else {
        std::operator+(&local_420,"Non-repeated field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
        std::operator+(&local_400,&local_420,"\" is specified multiple times.");
        ReportError(this,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
        this_local._7_1_ = 0;
        local_98 = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_98 = 1;
    }
  }
LAB_002c73c8:
  std::__cxx11::string::~string((string *)&field);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeIdentifier(&field_name));
      while (TryConsume(".")) {
        string part;
        DO(ConsumeIdentifier(&part));
        field_name += ".";
        field_name += part;
      }
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      field = descriptor->FindFieldByName(field_name);
      // Group names are expected to be capitalized as they appear in the
      // .proto file, which actually matches their type names, not their field
      // names.
      if (field == NULL) {
        string lower_field_name = field_name;
        LowerString(&lower_field_name);
        field = descriptor->FindFieldByName(lower_field_name);
        // If the case-insensitive match worked but the field is NOT a group,
        if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
          field = NULL;
        }
      }
      // Again, special-case group names as described above.
      if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
          && field->message_type()->name() != field_name) {
        field = NULL;
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the begining of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    // Fail if the field is not repeated and it has already been specified.
    if ((singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
        !field->is_repeated() && reflection->HasField(*message, field)) {
      ReportError("Non-repeated field \"" + field_name +
                  "\" is specified multiple times.");
      return false;
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      TryConsume(":");
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(Consume(":"));
      if (field->is_repeated() && TryConsume("[")) {
        // Short repeated format, e.g.  "foo: [1, 2, 3]"
        while (true) {
          DO(ConsumeFieldValue(message, reflection, field));
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      } else {
        DO(ConsumeFieldValue(message, reflection, field));
      }
    }

    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }